

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::
BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
::BinaryViewExpression
          (BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
           *this,ViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float>
                 *e1,
          ViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float> *e2)

{
  size_t sVar1;
  size_t sVar2;
  size_t j;
  ulong dimension;
  bool assertion;
  
  this->e1_ = (expression_type_1 *)e1;
  this->e2_ = (expression_type_2 *)e2;
  if (*(long *)(e1 + 0x30) == 0) {
    assertion = false;
  }
  else {
    assertion = *(long *)(e2 + 0x30) != 0;
  }
  marray_detail::Assert<bool>(assertion);
  sVar1 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(this->e1_);
  sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  marray_detail::Assert<bool>(sVar1 == sVar2);
  dimension = 0;
  while( true ) {
    sVar1 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(this->e1_);
    if (sVar1 <= dimension) break;
    sVar1 = View<float,_true,_std::allocator<unsigned_long>_>::shape(this->e1_,dimension);
    sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::shape(this->e2_,dimension);
    marray_detail::Assert<bool>(sVar1 == sVar2);
    dimension = dimension + 1;
  }
  return;
}

Assistant:

BinaryViewExpression(const ViewExpression<E1, T1>& e1, 
        const ViewExpression<E2, T2>& e2) 
        : e1_(e1), e2_(e2), // cast!
          binaryFunctor_(BinaryFunctor()) 
        {
            if(!MARRAY_NO_DEBUG) {
                marray_detail::Assert(e1_.size() != 0 && e2_.size() != 0);
                marray_detail::Assert(e1_.dimension() == e2_.dimension());
                for(std::size_t j=0; j<e1_.dimension(); ++j) {
                    marray_detail::Assert(e1_.shape(j) == e2_.shape(j));
                }
            }
        }